

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O0

Bmcs_Man_t * Bmcs_ManStart(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  int iVar1;
  Bmcs_Man_t *pBVar2;
  Gia_Man_t *pGVar3;
  satoko_t *psVar4;
  undefined1 local_90 [8];
  satoko_opts_t opts;
  int Lit;
  int i;
  Bmcs_Man_t *p;
  Bmc_AndPar_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  pBVar2 = (Bmcs_Man_t *)calloc(1,0x3a0);
  opts.garbage_max_ratio = (float)Abc_Var2Lit(0,1);
  satoko_default_opts((satoko_opts_t *)local_90);
  local_90 = (undefined1  [8])(long)pPars->nConfLimit;
  iVar1 = Gia_ManRegNum(pGia);
  if (0 < iVar1) {
    pBVar2->pPars = pPars;
    pBVar2->pGia = pGia;
    iVar1 = Gia_ManObjNum(pGia);
    pGVar3 = Gia_ManStart(iVar1 * 3);
    pBVar2->pFrames = pGVar3;
    Gia_ManHashStart(pBVar2->pFrames);
    pBVar2->pClean = (Gia_Man_t *)0x0;
    Vec_PtrGrow(&pBVar2->vGia2Fr,1000);
    iVar1 = Gia_ManCiNum(pGia);
    Vec_IntGrow(&pBVar2->vFr2Sat,iVar1 * 3);
    Vec_IntPush(&pBVar2->vFr2Sat,0);
    iVar1 = Gia_ManCiNum(pGia);
    Vec_IntGrow(&pBVar2->vCiMap,iVar1 * 3);
    opts.verbose = '\0';
    opts.no_simplify = '\0';
    opts._102_2_ = 0;
    for (; (int)opts._100_4_ < pPars->nProcs; opts._100_4_ = opts._100_4_ + 1) {
      opts.prop_limit = (long)(-(double)(int)opts._100_4_ * 0.05 + 0.8);
      opts.f_rst = -(double)(int)opts._100_4_ * 0.05 + 1.4;
      opts.clause_max_sz_bin_resol = (uint)((float)(int)opts._100_4_ * 0.05 + 0.3);
      psVar4 = satoko_create();
      pBVar2->pSats[(int)opts._100_4_] = psVar4;
      satoko_configure(pBVar2->pSats[(int)opts._100_4_],(satoko_opts_t *)local_90);
      satoko_add_variable(pBVar2->pSats[(int)opts._100_4_],'\0');
      satoko_add_clause(pBVar2->pSats[(int)opts._100_4_],(int *)&opts.garbage_max_ratio,1);
      satoko_set_stop(pBVar2->pSats[(int)opts._100_4_],&pBVar2->fStopNow);
    }
    pBVar2->nSatVars = 1;
    return pBVar2;
  }
  __assert_fail("Gia_ManRegNum(pGia) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                ,0x174,"Bmcs_Man_t *Bmcs_ManStart(Gia_Man_t *, Bmc_AndPar_t *)");
}

Assistant:

Bmcs_Man_t * Bmcs_ManStart( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    Bmcs_Man_t * p = ABC_CALLOC( Bmcs_Man_t, 1 ); 
    int i, Lit = Abc_Var2Lit( 0, 1 );
    satoko_opts_t opts;
    satoko_default_opts(&opts);
    opts.conf_limit = pPars->nConfLimit;
    assert( Gia_ManRegNum(pGia) > 0 );
    p->pPars   = pPars;
    p->pGia    = pGia;
    p->pFrames = Gia_ManStart( 3*Gia_ManObjNum(pGia) );  Gia_ManHashStart(p->pFrames);
    p->pClean  = NULL;
//    Vec_PtrFill( &p->vGia2Fr, Gia_ManCountTents(pGia)+1, NULL );
//    for ( i = 0; i < Vec_PtrSize(&p->vGia2Fr); i++ )
//        Vec_PtrWriteEntry( &p->vGia2Fr, i, ABC_FALLOC(int, Gia_ManObjNum(pGia)) );
    Vec_PtrGrow( &p->vGia2Fr, 1000 );  
    Vec_IntGrow( &p->vFr2Sat, 3*Gia_ManCiNum(pGia) );  
    Vec_IntPush( &p->vFr2Sat, 0 );
    Vec_IntGrow( &p->vCiMap, 3*Gia_ManCiNum(pGia) );
    for ( i = 0; i < pPars->nProcs; i++ )
    {
        // modify parameters to get different SAT solvers
        opts.f_rst = 0.8 - i * 0.05;
        opts.b_rst = 1.4 - i * 0.05;
        opts.garbage_max_ratio = (float) 0.3 + i * 0.05;
        // create SAT solvers
        p->pSats[i] = bmc_sat_solver_start( i );  
#ifdef ABC_USE_EXT_SOLVERS
        p->pSats[i]->SolverType = i;
#else
        satoko_configure(p->pSats[i], &opts);
#endif
        bmc_sat_solver_addvar( p->pSats[i] );
        bmc_sat_solver_addclause( p->pSats[i], &Lit, 1 );  
        bmc_sat_solver_setstop( p->pSats[i], &p->fStopNow );
    }
    p->nSatVars = 1;
    return p;
}